

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyFileGuard.h
# Opt level: O0

void __thiscall jbcoin::KeyFileGuard::~KeyFileGuard(KeyFileGuard *this)

{
  exception *e;
  KeyFileGuard *this_local;
  
  rmDir(this,&this->subDir_);
  boost::filesystem::path::~path(&this->subDir_);
  return;
}

Assistant:

~KeyFileGuard ()
    {
        try
        {
            using namespace boost::filesystem;

            rmDir (subDir_);
        }
        catch (std::exception& e)
        {
            // if we throw here, just let it die.
            test_.log << "Error in ~KeyFileGuard: " << e.what () << std::endl;
        };
    }